

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlc.c
# Opt level: O1

int XMLNode_remove_attribute(XMLNode *node,int i_attr)

{
  int iVar1;
  SXML_CHAR *pSVar2;
  XMLAttribute *__src;
  ulong uVar3;
  XMLAttribute *__dest;
  int iVar4;
  
  iVar4 = -1;
  if ((((node != (XMLNode *)0x0) && (uVar3 = (ulong)(uint)i_attr, -1 < i_attr)) &&
      (node->init_value == 0x19770522)) && (iVar1 = node->n_attributes, i_attr < iVar1)) {
    if (iVar1 == 1) {
      __dest = (XMLAttribute *)0x0;
    }
    else {
      __dest = (XMLAttribute *)malloc((ulong)(iVar1 - 1) * 0x18);
      if (__dest == (XMLAttribute *)0x0) {
        return -1;
      }
    }
    pSVar2 = node->attributes[uVar3].name;
    if (pSVar2 != (SXML_CHAR *)0x0) {
      free(pSVar2);
    }
    pSVar2 = node->attributes[uVar3].value;
    if (pSVar2 != (SXML_CHAR *)0x0) {
      free(pSVar2);
    }
    if (__dest != (XMLAttribute *)0x0) {
      __src = node->attributes;
      memcpy(__dest,__src,uVar3 * 0x18);
      memcpy(__dest + uVar3,__src + uVar3 + 1,(long)(~i_attr + node->n_attributes) * 0x18);
    }
    if (node->attributes != (XMLAttribute *)0x0) {
      free(node->attributes);
    }
    node->attributes = __dest;
    iVar4 = node->n_attributes + -1;
    node->n_attributes = iVar4;
  }
  return iVar4;
}

Assistant:

int XMLNode_remove_attribute(XMLNode* node, int i_attr)
{
	XMLAttribute* pt;
	if (node == NULL || node->init_value != XML_INIT_DONE || i_attr < 0 || i_attr >= node->n_attributes)
		return -1;
	
	/* Before modifying first see if we run out of memory */
	if (node->n_attributes == 1)
		pt = NULL;
	else {
		pt = __malloc((node->n_attributes - 1) * sizeof(XMLAttribute));
		if (pt == NULL)
			return -1;
	}

	/* Can't fail anymore, free item */
	if (node->attributes[i_attr].name != NULL) __free(node->attributes[i_attr].name);
	if (node->attributes[i_attr].value != NULL) __free(node->attributes[i_attr].value);
	
	if (pt != NULL) {
		memcpy(pt, node->attributes, i_attr * sizeof(XMLAttribute));
		memcpy(&pt[i_attr], &node->attributes[i_attr + 1], (node->n_attributes - i_attr - 1) * sizeof(XMLAttribute));
	}
	if (node->attributes != NULL)
		__free(node->attributes);
	node->attributes = pt;
	node->n_attributes--;
	
	return node->n_attributes;
}